

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Document::ReadConnections(Document *this)

{
  ObjectMap *this_00;
  Scope *this_01;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_02;
  bool bVar1;
  Element *pEVar2;
  Token *pTVar3;
  iterator iVar4;
  Connection *this_03;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var5;
  Token *t;
  Token *t_00;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar6;
  allocator<char> local_c9;
  uint64_t dest;
  uint64_t src;
  Document *local_b8;
  uint64_t local_b0;
  _Base_ptr local_a8;
  string local_a0;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
  *local_80;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
  *local_78;
  string local_70;
  string local_50;
  
  this_01 = (this->parser->root)._M_t.
            super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t
            .super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
            super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_b8 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Connections",(allocator<char> *)&local_70);
  pEVar2 = Scope::operator[](this_01,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((pEVar2 == (Element *)0x0) ||
     (this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                 *)(pEVar2->compound)._M_t.
                   super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
                   .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl,
     this_02 ==
     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
      *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"no Connections dictionary found",(allocator<char> *)&local_70);
    Util::DOMError(&local_a0,(Element *)0x0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"C",(allocator<char> *)&local_70);
  pVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::equal_range(this_02,&local_a0);
  _Var5 = pVar6.first._M_node;
  std::__cxx11::string::~string((string *)&local_a0);
  this_00 = &local_b8->objects;
  local_a8 = &(local_b8->objects)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_78 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
              *)&local_b8->src_connections;
  local_80 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
              *)&local_b8->dest_connections;
  local_b0 = 0;
  do {
    if (_Var5._M_node == pVar6.second._M_node._M_node) {
      return;
    }
    pEVar2 = *(Element **)(_Var5._M_node + 2);
    pTVar3 = GetRequiredToken(pEVar2,0);
    ParseTokenAsString_abi_cxx11_(&local_a0,(FBX *)pTVar3,t);
    bVar1 = std::operator==(&local_a0,"PP");
    if (!bVar1) {
      pTVar3 = GetRequiredToken(pEVar2,1);
      src = ParseTokenAsID(pTVar3);
      pTVar3 = GetRequiredToken(pEVar2,2);
      dest = ParseTokenAsID(pTVar3);
      bVar1 = std::operator==(&local_a0,"OP");
      if (bVar1) {
        pTVar3 = GetRequiredToken(pEVar2,3);
        ParseTokenAsString_abi_cxx11_(&local_70,(FBX *)pTVar3,t_00);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"",(allocator<char> *)&local_50);
      }
      iVar4 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
              ::find(&this_00->_M_t,&src);
      if (iVar4._M_node == local_a8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"source object for connection does not exist",&local_c9);
        Util::DOMWarning(&local_50,pEVar2);
LAB_00527350:
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        iVar4 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
                ::find(&this_00->_M_t,&dest);
        if (iVar4._M_node == local_a8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"destination object for connection does not exist",
                     &local_c9);
          Util::DOMWarning(&local_50,pEVar2);
          goto LAB_00527350;
        }
        this_03 = (Connection *)operator_new(0x40);
        Connection::Connection(this_03,local_b0,src,dest,&local_70,local_b8);
        local_50._M_dataplus._M_p = (pointer)src;
        local_50._M_string_length = (size_type)this_03;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
        ::_M_insert_equal<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>
                  (local_78,(pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> *)&local_50)
        ;
        local_50._M_dataplus._M_p = (pointer)dest;
        local_50._M_string_length = (size_type)this_03;
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
        ::_M_insert_equal<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>
                  (local_80,(pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> *)&local_50)
        ;
        local_b0 = local_b0 + 1;
      }
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_a0);
    _Var5._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var5._M_node);
  } while( true );
}

Assistant:

void Document::ReadConnections()
{
    const Scope& sc = parser.GetRootScope();
    // read property templates from "Definitions" section
    const Element* const econns = sc["Connections"];
    if(!econns || !econns->Compound()) {
        DOMError("no Connections dictionary found");
    }

    uint64_t insertionOrder = 0l;
    const Scope& sconns = *econns->Compound();
    const ElementCollection conns = sconns.GetCollection("C");
    for(ElementMap::const_iterator it = conns.first; it != conns.second; ++it) {
        const Element& el = *(*it).second;
        const std::string& type = ParseTokenAsString(GetRequiredToken(el,0));

        // PP = property-property connection, ignored for now
        // (tokens: "PP", ID1, "Property1", ID2, "Property2")
        if ( type == "PP" ) {
            continue;
        }

        const uint64_t src = ParseTokenAsID(GetRequiredToken(el,1));
        const uint64_t dest = ParseTokenAsID(GetRequiredToken(el,2));

        // OO = object-object connection
        // OP = object-property connection, in which case the destination property follows the object ID
        const std::string& prop = (type == "OP" ? ParseTokenAsString(GetRequiredToken(el,3)) : "");

        if(objects.find(src) == objects.end()) {
            DOMWarning("source object for connection does not exist",&el);
            continue;
        }

        // dest may be 0 (root node) but we added a dummy object before
        if(objects.find(dest) == objects.end()) {
            DOMWarning("destination object for connection does not exist",&el);
            continue;
        }

        // add new connection
        const Connection* const c = new Connection(insertionOrder++,src,dest,prop,*this);
        src_connections.insert(ConnectionMap::value_type(src,c));
        dest_connections.insert(ConnectionMap::value_type(dest,c));
    }
}